

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacket::~RTCPCompoundPacket(RTCPCompoundPacket *this)

{
  ~RTCPCompoundPacket(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

RTCPCompoundPacket::~RTCPCompoundPacket()
{
	ClearPacketList();
	if (compoundpacket && deletepacket)
		RTPDeleteByteArray(compoundpacket,GetMemoryManager());
}